

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::add_tess_level_input_to_interface_block
          (CompilerMSL *this,string *ib_var_ref,SPIRType *ib_type,SPIRVariable *var)

{
  size_t sVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t id;
  SPIRType *pSVar4;
  uint32_t ib_mbr_idx;
  BuiltIn builtin;
  string mbr_name;
  anon_class_40_5_c1147381 mark_locations;
  uint32_t local_a8;
  BuiltIn local_a4;
  string local_a0;
  string *local_80;
  anon_class_40_5_c1147381 local_78;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_80 = ib_var_ref;
  pSVar4 = Compiler::get_variable_element_type((Compiler *)this,var);
  local_a4 = Compiler::get_decoration
                       ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  bVar2 = Compiler::is_tessellating_triangles((Compiler *)this);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a8 = (uint32_t)
             (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size;
  local_78.this = this;
  local_78.var = var;
  local_78.ib_type = ib_type;
  local_78.builtin = &local_a4;
  if (bVar2) {
    local_78.ib_mbr_idx = &local_a8;
    ::std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x37103c);
    if (this->added_builtin_tess_level == false) {
      uVar3 = build_extended_vector_type(this,(pSVar4->super_IVariant).self.id,4,Unknown);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                (&ib_type->member_types,
                 (ib_type->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size + 1);
      sVar1 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size;
      (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
      [sVar1].id = uVar3;
      (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size = sVar1 + 1;
      Compiler::set_member_name
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,local_a8,&local_a0);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,local_a8,
                 DecorationBuiltIn,local_a4);
      add_tess_level_input_to_interface_block::anon_class_40_5_c1147381::operator()
                (&local_78,pSVar4);
      this->added_builtin_tess_level = true;
    }
  }
  else {
    local_78.ib_mbr_idx = &local_a8;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_50,this,(ulong)local_a4)
    ;
    ::std::__cxx11::string::operator=((string *)&local_a0,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    uVar3 = build_extended_vector_type
                      (this,(pSVar4->super_IVariant).self.id,
                       (uint)(local_a4 == BuiltInTessLevelOuter) * 2 + 2,Unknown);
    id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    pSVar4 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + uVar3);
    pSVar4 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>((Compiler *)this,id,pSVar4)
    ;
    pSVar4->pointer = true;
    pSVar4->pointer_depth = pSVar4->pointer_depth + 1;
    pSVar4->storage = StorageClassInput;
    (pSVar4->parent_type).id = uVar3;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
              (&ib_type->member_types,
               (ib_type->member_types).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size + 1);
    sVar1 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
    [sVar1].id = uVar3;
    (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
    buffer_size = sVar1 + 1;
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,local_a8,&local_a0);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,local_a8,DecorationBuiltIn
               ,local_a4);
    add_tess_level_input_to_interface_block::anon_class_40_5_c1147381::operator()(&local_78,pSVar4);
  }
  add_tess_level_input(this,local_80,&local_a0,var);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::add_tess_level_input_to_interface_block(const std::string &ib_var_ref, SPIRType &ib_type,
                                                          SPIRVariable &var)
{
	auto &var_type = get_variable_element_type(var);

	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool triangles = is_tessellating_triangles();
	string mbr_name;

	// Add a reference to the variable type to the interface struct.
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

	const auto mark_locations = [&](const SPIRType &new_var_type) {
		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
		else if (inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
	};

	if (triangles)
	{
		// Triangles are tricky, because we want only one member in the struct.
		mbr_name = "gl_TessLevel";

		// If we already added the other one, we can skip this step.
		if (!added_builtin_tess_level)
		{
			uint32_t type_id = build_extended_vector_type(var_type.self, 4);

			ib_type.member_types.push_back(type_id);

			// Give the member a name
			set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

			// We cannot decorate both, but the important part is that
			// it's marked as builtin so we can get automatic attribute assignment if needed.
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);

			mark_locations(var_type);
			added_builtin_tess_level = true;
		}
	}
	else
	{
		mbr_name = builtin_to_glsl(builtin, StorageClassFunction);

		uint32_t type_id = build_extended_vector_type(var_type.self, builtin == BuiltInTessLevelOuter ? 4 : 2);

		uint32_t ptr_type_id = ir.increase_bound_by(1);
		auto &new_var_type = set<SPIRType>(ptr_type_id, get<SPIRType>(type_id));
		new_var_type.pointer = true;
		new_var_type.pointer_depth++;
		new_var_type.storage = StorageClassInput;
		new_var_type.parent_type = type_id;

		ib_type.member_types.push_back(type_id);

		// Give the member a name
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);

		mark_locations(new_var_type);
	}

	add_tess_level_input(ib_var_ref, mbr_name, var);
}